

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O2

void GCTM(lua_State *L)

{
  unsigned_short *puVar1;
  byte bVar2;
  lu_byte lVar3;
  ushort uVar4;
  global_State *pgVar5;
  StkId pTVar6;
  GCObject *pGVar7;
  Value *pVVar8;
  int iVar9;
  TValue *pTVar10;
  TValue v;
  
  pgVar5 = L->l_G;
  if (pgVar5->gcemergency != '\0') {
    __assert_fail("!g->gcemergency",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                  ,0x3eb,"void GCTM(lua_State *)");
  }
  v.value_ = (Value)pgVar5->tobefnz;
  bVar2 = (v.value_.gc)->marked;
  if ((bVar2 & 0x40) == 0) {
    __assert_fail("(((o)->marked) & ((1<<(6))))",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                  ,0x3d4,"GCObject *udata2finalize(global_State *)");
  }
  pgVar5->tobefnz = (v.value_.gc)->next;
  (v.value_.gc)->next = pgVar5->allgc;
  pgVar5->allgc = (GCObject *)v.value_;
  (v.value_.gc)->marked = bVar2 & 0xbf;
  if ((byte)(pgVar5->gcstate - 3) < 4) {
    (v.value_.gc)->marked = pgVar5->currentwhite & 0x18 | bVar2 & 0x87;
  }
  else if ((bVar2 & 7) == 3) {
    pgVar5->firstold1 = (GCObject *)v.value_;
  }
  v.tt_ = (v.value_.gc)->tt | 0x8000;
  pTVar10 = luaT_gettmbyobj(L,&v,TM_GC);
  if ((pTVar10 != (TValue *)0x0) && ((pTVar10->tt_ & 0xf) == 6)) {
    bVar2 = pgVar5->gcstp;
    lVar3 = L->allowhook;
    pgVar5->gcstp = bVar2 | 2;
    L->allowhook = '\0';
    pTVar6 = L->top;
    L->top = pTVar6 + 1;
    pGVar7 = (pTVar10->value_).gc;
    (pTVar6->value_).gc = pGVar7;
    uVar4 = pTVar10->tt_;
    pTVar6->tt_ = uVar4;
    if (((short)uVar4 < 0) &&
       (((uVar4 & 0x7f) != (ushort)pGVar7->tt ||
        ((pGVar7->marked & (L->l_G->currentwhite ^ 0x18)) != 0)))) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                    ,0x3f4,"void GCTM(lua_State *)");
    }
    pVVar8 = &L->top->value_;
    L->top = (StkId)(pVVar8 + 2);
    *pVVar8 = v.value_;
    *(LuaType *)(pVVar8 + 1) = v.tt_;
    if (((short)v.tt_ < 0) &&
       (((v.tt_ & 0x7f) != (ushort)(v.value_.gc)->tt ||
        (((v.value_.gc)->marked & (L->l_G->currentwhite ^ 0x18)) != 0)))) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                    ,0x3f5,"void GCTM(lua_State *)");
    }
    puVar1 = &L->ci->callstatus;
    *puVar1 = *puVar1 | 0x100;
    iVar9 = luaD_pcall(L,dothecall,(void *)0x0,(long)L->top + (-0x20 - (long)L->stack),0);
    puVar1 = &L->ci->callstatus;
    *puVar1 = *puVar1 & 0xfeff;
    L->allowhook = lVar3;
    pgVar5->gcstp = bVar2;
    if (iVar9 != 0) {
      L->top = L->top + -1;
    }
  }
  return;
}

Assistant:

static void GCTM (lua_State *L) {
  global_State *g = G(L);
  const TValue *tm;
  TValue v;
  lua_assert(!g->gcemergency);
  setgcovalue(L, &v, udata2finalize(g));
  tm = luaT_gettmbyobj(L, &v, TM_GC);
  if (tm != NULL && ttisfunction(tm)) {  /* is there a finalizer? */
    int status;
    lu_byte oldah = L->allowhook;
    int oldgcstp  = g->gcstp;
    g->gcstp |= GCSTPGC;  /* avoid GC steps */
    L->allowhook = 0;  /* stop debug hooks during GC metamethod */
    setobj2s(L, L->top++, tm);  /* push finalizer... */
    setobj2s(L, L->top++, &v);  /* ... and its argument */
    L->ci->callstatus |= CIST_FIN;  /* will run a finalizer */
    status = luaD_pcall(L, dothecall, NULL, savestack(L, L->top - 2), 0);
    L->ci->callstatus &= ~CIST_FIN;  /* not running a finalizer anymore */
    L->allowhook = oldah;  /* restore hooks */
    g->gcstp = oldgcstp;  /* restore state */
    if (unlikely(status != LUA_OK)) {  /* error while running __gc? */
      //luaE_warnerror(L, "__gc");
      L->top--;  /* pops error object */
    }
  }
}